

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall sglr::ReferenceContext::pixelStorei(ReferenceContext *this,deUint32 pname,int param)

{
  if ((int)pname < 0xd05) {
    switch(pname) {
    case 0xcf2:
      if (-1 < param) {
        this->m_pixelUnpackRowLength = param;
        return;
      }
      break;
    case 0xcf3:
      if (-1 < param) {
        this->m_pixelUnpackSkipRows = param;
        return;
      }
      break;
    case 0xcf4:
      if (-1 < param) {
        this->m_pixelUnpackSkipPixels = param;
        return;
      }
      break;
    case 0xcf5:
      if (((uint)param < 9) && ((0x116U >> (param & 0x1fU) & 1) != 0)) {
        this->m_pixelUnpackAlignment = param;
        return;
      }
      break;
    default:
switchD_018a5445_default:
      if (this->m_lastError != 0) {
        return;
      }
      this->m_lastError = 0x500;
      return;
    }
  }
  else if (pname == 0xd05) {
    if (((uint)param < 9) && ((0x116U >> (param & 0x1fU) & 1) != 0)) {
      this->m_pixelPackAlignment = param;
      return;
    }
  }
  else if (pname == 0x806d) {
    if (-1 < param) {
      this->m_pixelUnpackSkipImages = param;
      return;
    }
  }
  else {
    if (pname != 0x806e) goto switchD_018a5445_default;
    if (-1 < param) {
      this->m_pixelUnpackImageHeight = param;
      return;
    }
  }
  if (this->m_lastError != 0) {
    return;
  }
  this->m_lastError = 0x501;
  return;
}

Assistant:

void ReferenceContext::pixelStorei (deUint32 pname, int param)
{
	switch (pname)
	{
		case GL_UNPACK_ALIGNMENT:
			RC_IF_ERROR(param != 1 && param != 2 && param != 4 && param != 8, GL_INVALID_VALUE, RC_RET_VOID);
			m_pixelUnpackAlignment = param;
			break;

		case GL_PACK_ALIGNMENT:
			RC_IF_ERROR(param != 1 && param != 2 && param != 4 && param != 8, GL_INVALID_VALUE, RC_RET_VOID);
			m_pixelPackAlignment = param;
			break;

		case GL_UNPACK_ROW_LENGTH:
			RC_IF_ERROR(param < 0, GL_INVALID_VALUE, RC_RET_VOID);
			m_pixelUnpackRowLength = param;
			break;

		case GL_UNPACK_SKIP_ROWS:
			RC_IF_ERROR(param < 0, GL_INVALID_VALUE, RC_RET_VOID);
			m_pixelUnpackSkipRows = param;
			break;

		case GL_UNPACK_SKIP_PIXELS:
			RC_IF_ERROR(param < 0, GL_INVALID_VALUE, RC_RET_VOID);
			m_pixelUnpackSkipPixels = param;
			break;

		case GL_UNPACK_IMAGE_HEIGHT:
			RC_IF_ERROR(param < 0, GL_INVALID_VALUE, RC_RET_VOID);
			m_pixelUnpackImageHeight = param;
			break;

		case GL_UNPACK_SKIP_IMAGES:
			RC_IF_ERROR(param < 0, GL_INVALID_VALUE, RC_RET_VOID);
			m_pixelUnpackSkipImages = param;
			break;

		default:
			setError(GL_INVALID_ENUM);
	}
}